

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_extra.c
# Opt level: O2

void duckdb_je_pa_shard_postfork_child(tsdn_t *tsdn,pa_shard_t *shard)

{
  duckdb_je_edata_cache_postfork_child(tsdn,&shard->edata_cache);
  duckdb_je_ecache_postfork_child(tsdn,&(shard->pac).ecache_dirty);
  duckdb_je_ecache_postfork_child(tsdn,&(shard->pac).ecache_muzzy);
  duckdb_je_ecache_postfork_child(tsdn,&(shard->pac).ecache_retained);
  duckdb_je_malloc_mutex_postfork_child(tsdn,&(shard->pac).grow_mtx);
  duckdb_je_malloc_mutex_postfork_child(tsdn,&(shard->pac).decay_dirty.mtx);
  duckdb_je_malloc_mutex_postfork_child(tsdn,&(shard->pac).decay_muzzy.mtx);
  if (shard->ever_used_hpa == true) {
    duckdb_je_sec_postfork_child(tsdn,&shard->hpa_sec);
    duckdb_je_hpa_shard_postfork_child(tsdn,&shard->hpa_shard);
    return;
  }
  return;
}

Assistant:

void
pa_shard_postfork_child(tsdn_t *tsdn, pa_shard_t *shard) {
	edata_cache_postfork_child(tsdn, &shard->edata_cache);
	ecache_postfork_child(tsdn, &shard->pac.ecache_dirty);
	ecache_postfork_child(tsdn, &shard->pac.ecache_muzzy);
	ecache_postfork_child(tsdn, &shard->pac.ecache_retained);
	malloc_mutex_postfork_child(tsdn, &shard->pac.grow_mtx);
	malloc_mutex_postfork_child(tsdn, &shard->pac.decay_dirty.mtx);
	malloc_mutex_postfork_child(tsdn, &shard->pac.decay_muzzy.mtx);
	if (shard->ever_used_hpa) {
		sec_postfork_child(tsdn, &shard->hpa_sec);
		hpa_shard_postfork_child(tsdn, &shard->hpa_shard);
	}
}